

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formular_inline.h
# Opt level: O2

float formularAllShipAtk(int *shipAtk)

{
  int iVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar4 = 0.0;
  lVar3 = 0xe;
  iVar1 = carrierNum;
  for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
    if (shipAtk[lVar2] != 0) {
      iVar1 = (int)((double)(shipAtk[lVar2] / 10 +
                            (theCarrier.super__Vector_base<Carrier,_std::allocator<Carrier>_>.
                             _M_impl.super__Vector_impl_data._M_start)->gridSize[lVar3 + -10]) * 1.5
                   ) + 0x37;
      fVar5 = formula_shipAtk_cocurHeading(iVar1);
      fVar5 = armorSimu((int)fVar5);
      fVar6 = formula_shipAtk_invertHeading(iVar1);
      fVar6 = armorSimu((int)fVar6);
      fVar4 = fVar4 + (SQRT((float)(int)lVar2) * accu_coef + 1.0) * (fVar5 * 0.6 + fVar6 * 0.4);
      iVar1 = carrierNum;
    }
    lVar3 = lVar3 + 0x10;
  }
  return fVar4;
}

Assistant:

inline float formularAllShipAtk(int shipAtk[]){
    float res=0;
    for(int i=0;i<carrierNum;i++){
        if(shipAtk[i] == 0) continue;//��վ
        int rawDamage = formula_shipAtk_rawDamage(shipAtk[i], theCarrier[i].atk);
        res += (armorSimu(formula_shipAtk_cocurHeading(rawDamage))*0.6 + armorSimu(formula_shipAtk_invertHeading(rawDamage))*0.4) * (1+accu_coef*sqrt(i));
    }
    return res;
}